

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O3

void varianceFilter(Mat *image,int l)

{
  int iVar1;
  _InputArray *p_Var2;
  Mat sigma;
  Mat sqrs;
  Mat mean;
  Mat image32f;
  _InputArray local_4d8;
  undefined8 local_4c0;
  int local_4b8;
  int local_4b4;
  undefined8 local_4b0;
  int local_4a8;
  int local_4a4;
  undefined1 local_4a0 [16];
  Size local_490;
  Mat local_430 [96];
  Mat local_3d0 [144];
  _OutputArray local_340;
  undefined4 local_328;
  Mat *local_320;
  undefined8 local_318;
  undefined4 local_310 [2];
  Mat *local_308;
  undefined8 local_300;
  Mat local_2b0 [96];
  Mat local_250 [96];
  Mat local_1f0 [96];
  undefined1 local_190 [16];
  Size local_180;
  Mat local_120 [96];
  Mat aMStack_c0 [144];
  
  cv::Mat::Mat(local_1f0);
  local_490.width = 0;
  local_490.height = 0;
  local_4a0._0_4_ = 0x2010000;
  local_4a0._8_8_ = local_1f0;
  cv::Mat::convertTo((_OutputArray *)image,(int)local_4a0,1.0,0.0);
  cv::Mat::Mat(local_250);
  local_490.width = 0;
  local_490.height = 0;
  local_4a0._0_4_ = 0x1010000;
  local_180.width = 0;
  local_180.height = 0;
  local_190._0_4_ = 0x2010000;
  iVar1 = l * 2 + 1;
  local_4b0 = 0xffffffffffffffff;
  local_4a8 = iVar1;
  local_4a4 = iVar1;
  local_4a0._8_8_ = local_1f0;
  local_190._8_8_ = local_250;
  cv::blur();
  cv::Mat::Mat(local_2b0);
  local_300 = 0;
  local_310[0] = 0x1010000;
  local_308 = local_1f0;
  cv::Mat::mul((_InputArray *)local_4a0,1.0);
  cv::_InputArray::_InputArray((_InputArray *)local_190,(MatExpr *)local_4a0);
  local_4d8.sz.width = 0;
  local_4d8.sz.height = 0;
  local_4d8.flags = 0x2010000;
  local_4c0 = 0xffffffffffffffff;
  local_4d8.obj = local_2b0;
  local_4b8 = iVar1;
  local_4b4 = iVar1;
  cv::blur(local_190);
  cv::Mat::~Mat(local_3d0);
  cv::Mat::~Mat(local_430);
  cv::Mat::~Mat((Mat *)(local_4a0 + 0x10));
  cv::Mat::Mat((Mat *)local_310);
  local_318 = 0;
  local_328 = 0x1010000;
  local_320 = local_250;
  cv::Mat::mul((_InputArray *)local_190,1.0);
  cv::operator-((Mat *)local_4a0,(MatExpr *)local_2b0);
  cv::_InputArray::_InputArray(&local_4d8,(MatExpr *)local_4a0);
  local_340.super__InputArray.sz.width = 0;
  local_340.super__InputArray.sz.height = 0;
  local_340.super__InputArray.flags = 0x2010000;
  local_340.super__InputArray.obj = (Mat *)local_310;
  cv::sqrt(&local_4d8,&local_340);
  cv::Mat::~Mat(local_3d0);
  cv::Mat::~Mat(local_430);
  cv::Mat::~Mat((Mat *)(local_4a0 + 0x10));
  cv::Mat::~Mat(aMStack_c0);
  cv::Mat::~Mat(local_120);
  cv::Mat::~Mat((Mat *)(local_190 + 0x10));
  local_490.width = 0;
  local_490.height = 0;
  local_4a0._0_4_ = 0x1010000;
  local_180.width = 0;
  local_180.height = 0;
  local_190._0_4_ = 0x3010000;
  local_4a0._8_8_ = (Mat *)local_310;
  local_190._8_8_ = image;
  p_Var2 = (_InputArray *)cv::noArray();
  cv::normalize((_InputArray *)local_4a0,(_InputOutputArray *)local_190,0.0,255.0,0x20,-1,p_Var2);
  local_490.width = 0;
  local_490.height = 0;
  local_4a0._0_4_ = 0x2010000;
  local_4a0._8_8_ = image;
  cv::Mat::convertTo((_OutputArray *)image,(int)local_4a0,1.0,0.0);
  cv::Mat::~Mat((Mat *)local_310);
  cv::Mat::~Mat(local_2b0);
  cv::Mat::~Mat(local_250);
  cv::Mat::~Mat(local_1f0);
  return;
}

Assistant:

void varianceFilter(cv::Mat & image, int l) {
    cv::Mat image32f;
    image.convertTo(image32f, CV_32F);

    cv::Mat mean;
    cv::blur(image32f, mean, cv::Size(l*2+1, l*2+1));

    cv::Mat sqrs;
    cv::blur(image32f.mul(image32f), sqrs, cv::Size(l*2+1, l*2+1));

    cv::Mat sigma;
    cv::sqrt(sqrs - mean.mul(mean), sigma);

    cv::normalize(sigma, image, 0.0, 255.0, cv::NORM_MINMAX);
    image.convertTo(image, CV_8UC1);
}